

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O2

int Dar_CutMergeOrdered(Dar_Cut_t *pC,Dar_Cut_t *pC0,Dar_Cut_t *pC1)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  
  uVar6 = *(uint *)&pC0->field_0x4;
  uVar3 = *(uint *)&pC1->field_0x4 >> 0x1d;
  if (uVar6 >> 0x1d < uVar3) {
    __assert_fail("pC0->nLeaves >= pC1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                  ,0x10e,"int Dar_CutMergeOrdered(Dar_Cut_t *, Dar_Cut_t *, Dar_Cut_t *)");
  }
  if ((uVar6 >> 0x1d == 4) && (uVar3 == 4)) {
    if (pC0->uSign == pC1->uSign) {
      lVar7 = 0;
      do {
        if (lVar7 == 4) {
          for (uVar5 = 0; uVar5 < uVar6 >> 0x1d; uVar5 = uVar5 + 1) {
            pC->pLeaves[uVar5] = pC0->pLeaves[uVar5];
            uVar6 = *(uint *)&pC0->field_0x4;
          }
          uVar6 = uVar6 & 0xe0000000;
          goto LAB_00421cea;
        }
        piVar4 = pC0->pLeaves + lVar7;
        piVar1 = pC1->pLeaves + lVar7;
        lVar7 = lVar7 + 1;
      } while (*piVar4 == *piVar1);
    }
    iVar8 = 0;
  }
  else {
    piVar4 = pC->pLeaves;
    uVar6 = 0;
    uVar3 = 0;
    for (lVar7 = 0; lVar7 != -0x80000000; lVar7 = lVar7 + -0x20000000) {
      uVar9 = *(uint *)&pC0->field_0x4 >> 0x1d;
      if (uVar3 == *(uint *)&pC1->field_0x4 >> 0x1d) {
        if (uVar6 == uVar9) {
          uVar6 = -(int)lVar7;
          goto LAB_00421cea;
        }
        iVar8 = pC0->pLeaves[(int)uVar6];
        uVar6 = uVar6 + 1;
LAB_00421c64:
        *piVar4 = iVar8;
      }
      else {
        if (uVar6 == uVar9) {
          iVar8 = pC1->pLeaves[(int)uVar3];
          uVar3 = uVar3 + 1;
          goto LAB_00421c64;
        }
        iVar8 = pC0->pLeaves[(int)uVar6];
        iVar2 = pC1->pLeaves[(int)uVar3];
        if (iVar8 < iVar2) {
          uVar6 = uVar6 + 1;
          goto LAB_00421c64;
        }
        if (iVar2 < iVar8) {
          uVar3 = uVar3 + 1;
          *piVar4 = iVar2;
        }
        else {
          uVar6 = uVar6 + 1;
          *piVar4 = iVar8;
          uVar3 = uVar3 + 1;
        }
      }
      piVar4 = piVar4 + 1;
    }
    iVar8 = 0;
    if (((int)(*(uint *)&pC0->field_0x4 >> 0x1d) <= (int)uVar6) &&
       (uVar6 = 0x80000000, (int)(*(uint *)&pC1->field_0x4 >> 0x1d) <= (int)uVar3)) {
LAB_00421cea:
      *(uint *)&pC->field_0x4 = *(uint *)&pC->field_0x4 & 0x1fffffff | uVar6;
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

static inline int Dar_CutMergeOrdered( Dar_Cut_t * pC, Dar_Cut_t * pC0, Dar_Cut_t * pC1 )
{ 
    int i, k, c;
    assert( pC0->nLeaves >= pC1->nLeaves );

    // the case of the largest cut sizes
    if ( pC0->nLeaves == 4 && pC1->nLeaves == 4 )
    {
        if ( pC0->uSign != pC1->uSign )
            return 0;
        for ( i = 0; i < (int)pC0->nLeaves; i++ )
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
        for ( i = 0; i < (int)pC0->nLeaves; i++ )
            pC->pLeaves[i] = pC0->pLeaves[i];
        pC->nLeaves = pC0->nLeaves;
        return 1;
    }

    // the case when one of the cuts is the largest
    if ( pC0->nLeaves == 4 )
    {
        if ( (pC0->uSign & pC1->uSign) != pC1->uSign )
            return 0;
        for ( i = 0; i < (int)pC1->nLeaves; i++ )
        {
            for ( k = (int)pC0->nLeaves - 1; k >= 0; k-- )
                if ( pC0->pLeaves[k] == pC1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < (int)pC0->nLeaves; i++ )
            pC->pLeaves[i] = pC0->pLeaves[i];
        pC->nLeaves = pC0->nLeaves;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < 4; c++ )
    {
        if ( k == (int)pC1->nLeaves )
        {
            if ( i == (int)pC0->nLeaves )
            {
                pC->nLeaves = c;
                return 1;
            }
            pC->pLeaves[c] = pC0->pLeaves[i++];
            continue;
        }
        if ( i == (int)pC0->nLeaves )
        {
            if ( k == (int)pC1->nLeaves )
            {
                pC->nLeaves = c;
                return 1;
            }
            pC->pLeaves[c] = pC1->pLeaves[k++];
            continue;
        }
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            pC->pLeaves[c] = pC0->pLeaves[i++];
            continue;
        }
        if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            pC->pLeaves[c] = pC1->pLeaves[k++];
            continue;
        }
        pC->pLeaves[c] = pC0->pLeaves[i++]; 
        k++;
    }
    if ( i < (int)pC0->nLeaves || k < (int)pC1->nLeaves )
        return 0;
    pC->nLeaves = c;
    return 1;
}